

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<signed_char,_long_double>::Run
          (DataTransform<signed_char,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  NumericType NVar2;
  WarningType WVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  int iVar6;
  bool bVar7;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  char input_data;
  ushort local_2a8;
  ushort local_2a6;
  ushort local_2a4;
  ushort local_2a2;
  ushort local_2a0;
  short local_29e;
  short local_29c;
  allocator local_299;
  string *local_298;
  double local_290;
  double local_288;
  long local_280;
  long local_278;
  ulong local_270;
  ulong local_268;
  longdouble local_25c;
  string local_250;
  string word;
  char buffer [128];
  
  local_298 = &this->print_format_;
  iVar6 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar7 = word._M_string_length == 0;
      if (!bVar7) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_2a0 = in_FPUControlWord | 0xc00;
        local_29c = (short)ROUND(in_ST0);
        input_data = (char)local_29c;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar7) goto LAB_00113f84;
      if (bVar7) {
        if (bVar7) {
LAB_001142aa:
          bVar7 = true;
          if ((this->is_ascii_output_ == true) && (iVar6 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_001142cc:
          bVar7 = false;
        }
        return bVar7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<signed_char>(&input_data,input_stream);
      if (!bVar7) goto LAB_001142aa;
LAB_00113f84:
      uVar4 = (ulong)input_data;
      local_29e = (short)input_data;
      lVar8 = (longdouble)local_29e;
      lVar11 = this->minimum_value_;
      lVar1 = this->maximum_value_;
      if (lVar11 < lVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if ((lVar11 <= lVar8) && (lVar11 = lVar1, lVar8 <= lVar1)) {
LAB_00114105:
            bVar7 = false;
            goto LAB_00114109;
          }
        }
        else if (NVar2 == kUnsignedInteger) {
          lVar9 = (longdouble)9.223372e+18;
          lVar10 = (longdouble)0;
          if (lVar9 <= lVar11) {
            lVar10 = lVar9;
          }
          local_2a6 = in_FPUControlWord | 0xc00;
          local_268 = (ulong)ROUND(lVar11 - lVar10);
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          if (((ulong)(lVar9 <= lVar11) << 0x3f ^ local_268) <= uVar4) {
            lVar10 = (longdouble)9.223372e+18;
            lVar11 = (longdouble)0;
            if (lVar10 <= lVar1) {
              lVar11 = lVar10;
            }
            local_2a8 = in_FPUControlWord | 0xc00;
            local_270 = (ulong)ROUND(lVar1 - lVar11);
            bVar7 = ((ulong)(lVar10 <= lVar1) << 0x3f ^ local_270) < uVar4;
            if (bVar7) {
              lVar8 = lVar1;
            }
            goto LAB_00114109;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_00114105;
          local_2a2 = in_FPUControlWord | 0xc00;
          local_278 = (long)ROUND(lVar11);
          in_ST4 = in_ST3;
          if (local_278 <= (long)uVar4) {
            local_2a4 = in_FPUControlWord | 0xc00;
            local_280 = (long)ROUND(lVar1);
            bVar7 = local_280 < (long)uVar4;
            if (bVar7) {
              lVar8 = lVar1;
            }
            goto LAB_00114109;
          }
        }
LAB_00114148:
        if (this->warning_type_ != kIgnore) {
          local_25c = lVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar6);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_299);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          lVar11 = local_25c;
          if (WVar3 == kExit) goto LAB_001142cc;
        }
      }
      else {
        bVar7 = false;
LAB_00114109:
        if ((bVar7) || (this->rounding_ == false)) {
          lVar11 = lVar8;
          if (bVar7) goto LAB_00114148;
        }
        else if (input_data < '\x01') {
          local_288 = (double)(int)input_data + -0.5;
          lVar11 = (longdouble)local_288;
        }
        else {
          local_290 = (double)(int)input_data + 0.5;
          lVar11 = (longdouble)local_290;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<long_double>(lVar11,local_298,0x80,buffer);
        if (!bVar7) goto LAB_001142cc;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar6 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
      }
      else {
        bVar7 = sptk::WriteStream<long_double>(lVar11,(ostream *)&std::cout);
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        in_ST7 = in_ST4;
        if (!bVar7) goto LAB_001142cc;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }